

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_vec2 nk_layout_space_to_screen(nk_context *ctx,nk_vec2 ret)

{
  nk_panel *pnVar1;
  nk_panel *layout;
  nk_window *win;
  nk_context *ctx_local;
  nk_vec2 ret_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x460b,
                  "struct nk_vec2 nk_layout_space_to_screen(struct nk_context *, struct nk_vec2)");
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      pnVar1 = ctx->current->layout;
      ctx_local._0_4_ = ret.x;
      ctx_local._4_4_ = ret.y;
      ctx_local = (nk_context *)
                  CONCAT44(ctx_local._4_4_ + (pnVar1->at_y - (float)*pnVar1->offset_y),
                           ctx_local._0_4_ + (pnVar1->at_x - (float)*pnVar1->offset_x));
      return (nk_vec2)ctx_local;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x460d,
                  "struct nk_vec2 nk_layout_space_to_screen(struct nk_context *, struct nk_vec2)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x460c,
                "struct nk_vec2 nk_layout_space_to_screen(struct nk_context *, struct nk_vec2)");
}

Assistant:

NK_API struct nk_vec2
nk_layout_space_to_screen(struct nk_context *ctx, struct nk_vec2 ret)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    win = ctx->current;
    layout = win->layout;

    ret.x += layout->at_x - (float)*layout->offset_x;
    ret.y += layout->at_y - (float)*layout->offset_y;
    return ret;
}